

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

void __thiscall
t_js_generator::parse_imports(t_js_generator *this,t_program *program,string *imports_string)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  istream *piVar2;
  long lVar3;
  runtime_error *prVar4;
  invalid_argument *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_bool>
  pVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> module_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> module_import_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> import_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> episode_file_path;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  string import;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  ifstream episode_file;
  byte abStack_3a0 [488];
  stringstream sstream;
  
  if (program->recursive_ == true) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar5,"[-gen js:imports=] option is not usable in recursive code generation mode");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&sstream,(string *)imports_string,_S_out|_S_in);
  import._M_dataplus._M_p = (pointer)&import.field_2;
  import._M_string_length = 0;
  import.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&sstream,(string *)&import,':');
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->imports,
               &import);
  }
  __lhs = (this->imports).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->imports).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__lhs == pbVar1) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar5,
               "invalid usage: [-gen js:imports=] requires at least one path (multiple paths are separated by \':\')"
              );
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  while( true ) {
    if (__lhs == pbVar1) {
      std::__cxx11::string::~string((string *)&import);
      std::__cxx11::stringstream::~stringstream((stringstream *)&sstream);
      return;
    }
    if (__lhs->_M_string_length == 0) break;
    if ((__lhs->_M_dataplus)._M_p[__lhs->_M_string_length - 1] == '/') {
      std::__cxx11::string::substr((ulong)&episode_file,(ulong)__lhs);
      std::__cxx11::string::operator=((string *)__lhs,(string *)&episode_file);
      std::__cxx11::string::~string((string *)&episode_file);
      if (__lhs->_M_string_length == 0) break;
    }
    std::ifstream::ifstream((string *)&episode_file);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    std::operator+(&module_name,__lhs,"/");
    std::operator+(&episode_file_path,&module_name,&episode_file_name_abi_cxx11_);
    std::__cxx11::string::~string((string *)&module_name);
    std::ifstream::open((string *)&episode_file,(_Ios_Openmode)&episode_file_path);
    if ((abStack_3a0[*(long *)(_episode_file + -0x18)] & 5) != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&import_path,"failed to open the file \'",&episode_file_path);
      std::operator+(&module_name,&import_path,"\'");
      std::runtime_error::runtime_error(prVar4,(string *)&module_name);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&episode_file,(string *)&line);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      lVar3 = std::__cxx11::string::find((char)&line,0x3a);
      if (lVar3 == -1) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_510,"the episode file \'",&episode_file_path);
        std::operator+(&module_import_path,&local_510,"\' is malformed, the line \'");
        std::operator+(&import_path,&module_import_path,&line);
        std::operator+(&module_name,&import_path,"\' does not have a key:value separator \':\'");
        std::runtime_error::runtime_error(prVar4,(string *)&module_name);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::substr((ulong)&module_name,(ulong)&line);
      std::__cxx11::string::substr((ulong)&import_path,(ulong)&line);
      if (module_name._M_string_length == 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_510,"the episode file \'",&episode_file_path);
        std::operator+(&module_import_path,&local_510,"\' is malformed, the module name is empty");
        std::runtime_error::runtime_error(prVar4,(string *)&module_import_path);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (import_path._M_string_length == 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_510,"the episode file \'",&episode_file_path);
        std::operator+(&module_import_path,&local_510,"\' is malformed, the import path is empty");
        std::runtime_error::runtime_error(prVar4,(string *)&module_import_path);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::rfind((char)__lhs,0x2f);
      std::__cxx11::string::substr((ulong)&local_460,(ulong)__lhs);
      std::operator+(&local_510,&local_460,"/");
      std::operator+(&module_import_path,&local_510,&import_path);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_460);
      pVar6 = std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::__cxx11::string_const&,std::__cxx11::string_const&>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)&this->module_name_2_import_path,&module_name,&module_import_path);
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_420,"multiple providers of import path found for ",&module_name);
        std::operator+(&local_400,&local_420,"\n\t");
        std::operator+(&local_3e0,&local_400,&module_import_path);
        std::operator+(&local_460,&local_3e0,"\n\t");
        std::operator+(&local_510,&local_460,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)pVar6.first.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              ._M_cur.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       + 0x28));
        std::runtime_error::runtime_error(prVar4,(string *)&local_510);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::~string((string *)&module_import_path);
      std::__cxx11::string::~string((string *)&import_path);
      std::__cxx11::string::~string((string *)&module_name);
    }
    std::__cxx11::string::~string((string *)&episode_file_path);
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream((string *)&episode_file);
    __lhs = __lhs + 1;
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"empty paths are not allowed in imports");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void t_js_generator::parse_imports(t_program* program, const std::string& imports_string) {
  if (program->get_recursive()) {
    throw std::invalid_argument("[-gen js:imports=] option is not usable in recursive code generation mode");
  }
  std::stringstream sstream(imports_string);
  std::string import;
  while (std::getline(sstream, import, ':')) {
    imports.emplace_back(import);
  }
  if (imports.empty()) {
    throw std::invalid_argument("invalid usage: [-gen js:imports=] requires at least one path "
          "(multiple paths are separated by ':')");
  }
  for (auto& import : imports) {
    // Strip trailing '/'
    if (!import.empty() && import[import.size() - 1] == '/') {
      import = import.substr(0, import.size() - 1);
    }
    if (import.empty()) {
      throw std::invalid_argument("empty paths are not allowed in imports");
    }
    std::ifstream episode_file;
    string line;
    const auto episode_file_path = import + "/" + episode_file_name;
    episode_file.open(episode_file_path);
    if (!episode_file) {
      throw std::runtime_error("failed to open the file '" + episode_file_path + "'");
    }
    while (std::getline(episode_file, line)) {
      const auto separator_position = line.find(':');
      if (separator_position == string::npos) {
        // could not find the separator in the line
        throw std::runtime_error("the episode file '" + episode_file_path + "' is malformed, the line '" + line
          + "' does not have a key:value separator ':'");
      }
      const auto module_name = line.substr(0, separator_position);
      const auto import_path = line.substr(separator_position + 1);
      if (module_name.empty()) {
        throw std::runtime_error("the episode file '" + episode_file_path + "' is malformed, the module name is empty");
      }
      if (import_path.empty()) {
        throw std::runtime_error("the episode file '" + episode_file_path + "' is malformed, the import path is empty");
      }
      const auto module_import_path = import.substr(import.find_last_of('/') + 1) + "/" + import_path;
      const auto result = module_name_2_import_path.emplace(module_name, module_import_path);
      if (!result.second) {
        throw std::runtime_error("multiple providers of import path found for " + module_name
          + "\n\t" + module_import_path + "\n\t" + result.first->second);
      }
    }
  }
}